

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O1

void __thiscall
Adjacency_Subgraph_update_levels_remove_Test::TestBody
          (Adjacency_Subgraph_update_levels_remove_Test *this)

{
  pointer puVar1;
  pointer puVar2;
  char cVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t sVar6;
  StringLike<const_char_*> *regex;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr;
  bool bVar8;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  Adjacency_Subgraph subgraph;
  Adjacency_Graph<false> graph;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1f0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1d0;
  long local_1c8 [3];
  AssertHelper local_1b0;
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  pointer local_188;
  pointer puStack_180;
  allocator_type local_131;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_120;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_110;
  Adjacency_Subgraph local_100;
  Adjacency_Graph<false> local_98;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_68;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> local_58;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  Disa::create_graph_structured<false>(&local_98,3);
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a8,__l,
             (allocator_type *)&local_1f0);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_100,&local_98,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a8
             ,2);
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,local_198._M_allocated_capacity - (long)local_1a8);
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00177c20;
  local_130 = p_Var5 + 1;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var5[1]._M_use_count = 0;
  p_Var5[1]._M_weak_count = 0;
  p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var5->_M_use_count = 2;
  }
  local_128 = p_Var5;
  local_110.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)local_130;
  local_110.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var5;
  Disa::Adjacency_Subgraph::update_levels(&local_100,&local_98,1,&local_110);
  if (local_110.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.
               super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  bVar8 = p_Var5[1]._vptr__Sp_counted_base != *(_func_int ***)&p_Var5[1]._M_use_count;
  local_1d8._M_head_impl._0_1_ = bVar8;
  pbStack_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar8) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d8,
               (AssertionResult *)"i_global_local->empty()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x206,(char *)local_1a8);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    if (local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  sVar6 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    ((hash<Disa::Adjacency_Graph<false>_> *)local_1a8,&local_98);
  local_1d8._M_head_impl._0_1_ = sVar6 == local_100.hash_parent;
  pbStack_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sVar6 != local_100.hash_parent) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d8,
               (AssertionResult *)"subgraph.is_parent(graph)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x207,(char *)local_1a8);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    if (local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((long)local_100.graph.offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_100.graph.offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.size_vertex()","5",(unsigned_long *)&local_1d8,
             (int *)&local_1f0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)((long)local_100.graph.vertex_adjacent_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_100.graph.vertex_adjacent_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) >> 1);
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.size_edge()","4",(unsigned_long *)&local_1d8,
             (int *)&local_1f0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1f0);
  local_1b0.data_ = (AssertHelperData *)((ulong)local_1b0.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(0)","0",(unsigned_long *)&local_1d8,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1f0);
  local_1b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(1)","1",(unsigned_long *)&local_1d8,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1f0);
  local_1b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(2)","1",(unsigned_long *)&local_1d8,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1f0);
  local_1b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(3)","1",(unsigned_long *)&local_1d8,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x20f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1f0);
  local_1b0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(4)","1",(unsigned_long *)&local_1d8,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x210,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long)local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            ._M_impl.super__Vector_impl_data._M_start != 8 &&
      local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    do {
      sVar6 = Disa::Adjacency_Subgraph::local_global(&local_100,(size_t *)&local_1d8);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_1a8,"(*i_global_local)[subgraph.local_global(i_vertex)]",
                 "i_vertex",(unsigned_long *)(local_130->_vptr__Sp_counted_base + sVar6),
                 (unsigned_long *)&local_1d8);
      if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
        testing::Message::Message((Message *)&local_1f0);
        pcVar7 = "";
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                   ,0x212,pcVar7);
        testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1f0);
        testing::internal::AssertHelper::~AssertHelper(&local_1b0);
        if (local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (**(code **)(*local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&_Stack_1a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     _Stack_1a0._M_pi);
      }
      local_1d8._M_head_impl = local_1d8._M_head_impl + 1;
    } while (((long)local_100.graph.offset.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_100.graph.offset.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) &&
            (local_1d8._M_head_impl <
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((long)local_100.graph.offset.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_100.graph.offset.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) - 1U)));
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a8,"(*i_global_local)[0]","std::numeric_limits<std::size_t>::max()",
             (unsigned_long *)local_130->_vptr__Sp_counted_base,(unsigned_long *)&local_1d8);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x213,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a8,"(*i_global_local)[2]","std::numeric_limits<std::size_t>::max()",
             (unsigned_long *)(local_130->_vptr__Sp_counted_base + 2),(unsigned_long *)&local_1d8);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x214,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a8,"(*i_global_local)[6]","std::numeric_limits<std::size_t>::max()",
             (unsigned_long *)(local_130->_vptr__Sp_counted_base + 6),(unsigned_long *)&local_1d8);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x215,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0xffffffffffffffff
  ;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1a8,"(*i_global_local)[8]","std::numeric_limits<std::size_t>::max()",
             (unsigned_long *)(local_130->_vptr__Sp_counted_base + 8),(unsigned_long *)&local_1d8);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x216,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_58.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_58.
  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Disa::Adjacency_Subgraph::update_levels(&local_100,&local_98,0,&local_58);
  if (local_58.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  sVar6 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    ((hash<Disa::Adjacency_Graph<false>_> *)local_1a8,&local_98);
  local_1d8._M_head_impl._0_1_ = sVar6 == local_100.hash_parent;
  pbStack_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sVar6 != local_100.hash_parent) {
    testing::Message::Message((Message *)&local_1f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,(internal *)&local_1d8,
               (AssertionResult *)"subgraph.is_parent(graph)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x219,(char *)local_1a8);
    testing::internal::AssertHelper::operator=(&local_1b0,(Message *)&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
    }
    if (local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_1d0,pbStack_1d0);
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_100.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_1d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (((long)local_100.graph.offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_100.graph.offset.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.size_vertex()","1",(unsigned_long *)&local_1d8,
             (int *)&local_1f0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)((long)local_100.graph.vertex_adjacent_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_100.graph.vertex_adjacent_list.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) >> 1);
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.size_edge()","0",(unsigned_long *)&local_1d8,
             (int *)&local_1f0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::vertex_level(&local_100,(size_t *)&local_1f0);
  local_1b0.data_ = local_1b0.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.vertex_level(0)","0",(unsigned_long *)&local_1d8,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Disa::Adjacency_Subgraph::local_global(&local_100,(size_t *)&local_1f0);
  local_1b0.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_1a8,"subgraph.local_global(0)","4",(unsigned_long *)&local_1d8,
             (int *)&local_1b0);
  if (local_1a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)&local_1d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_1a0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x21f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1f0,(Message *)&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1f0);
    if (local_1d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1a0._M_pi);
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    local_1d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x159680;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_1a8,
               (testing *)&local_1d8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_48,(PolymorphicMatcher *)local_1a8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1a0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
    }
    bVar8 = testing::internal::DeathTest::Create
                      ("subgraph.update_levels(Adjacency_Graph<false>(), 1, i_global_local)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_48,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
                       ,0x221,(DeathTest **)&local_1f0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_48);
    puVar1 = local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 5;
    if (bVar8) {
      if (local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        iVar4 = (**(code **)(*local_1f0.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start + 0x10))
                          (local_1f0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start);
        puVar2 = local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (iVar4 == 0) {
          iVar4 = (**(code **)(*local_1f0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start + 0x18))
                            (local_1f0.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start);
          bVar8 = testing::internal::ExitedUnsuccessfully(iVar4);
          cVar3 = (**(code **)(*puVar2 + 0x20))(puVar2,bVar8);
          if (cVar3 != '\0') goto LAB_0011fe14;
          iVar4 = 5;
          bVar8 = false;
        }
        else {
          if (iVar4 == 1) {
            bVar8 = testing::internal::AlwaysTrue();
            if (bVar8) {
              local_188 = (pointer)0x0;
              puStack_180 = (pointer)0x0;
              local_198._M_allocated_capacity = 0;
              local_198._8_8_ = 0;
              local_1a8 = (undefined1  [8])0x0;
              _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_120.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)local_130;
              local_120.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = local_128;
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_128->_M_use_count = local_128->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_128->_M_use_count = local_128->_M_use_count + 1;
              }
              Disa::Adjacency_Subgraph::update_levels
                        (&local_100,(Adjacency_Graph<false> *)local_1a8,1,&local_120);
              if (local_120.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_120.
                           super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
              }
              Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_1a8);
            }
            (**(code **)(*local_1f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + 0x28))
                      (local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,2);
            (**(code **)(*puVar2 + 0x28))(puVar2,0);
          }
LAB_0011fe14:
          iVar4 = 0;
          bVar8 = true;
        }
        (**(code **)(*puVar1 + 8))(puVar1);
        if (!bVar8) goto LAB_0011fe27;
      }
      iVar4 = 0;
    }
LAB_0011fe27:
    if (iVar4 == 0) goto LAB_0011fe81;
  }
  testing::Message::Message((Message *)local_1a8);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_1d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
             ,0x221,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)local_1a8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
  if (local_1a8 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)local_1a8 + 8))();
  }
LAB_0011fe81:
  local_1c8[1] = 0;
  pbStack_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1c8[0] = 0;
  local_1d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8;
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    local_1b0.data_ = (AssertHelperData *)&DAT_00000004;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_1b0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_1f0,__l_00,&local_131)
    ;
    Disa::Adjacency_Subgraph::Adjacency_Subgraph
              ((Adjacency_Subgraph *)local_1a8,&local_98,&local_1f0,2);
    local_68.
    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_68.
    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Disa::Adjacency_Subgraph::update_levels((Adjacency_Subgraph *)local_1a8,&local_98,1,&local_68);
    if (local_68.
        super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.
                 super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_1a8);
    if (local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1f0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1f0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_1d8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8) {
    operator_delete(local_1d8._M_head_impl,local_1c8[0] + 1);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_100);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_98);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, update_levels_remove) {
  Adjacency_Graph<false> graph = create_graph_structured<false>(3);
  Adjacency_Subgraph subgraph(graph, {4}, 2);
  std::shared_ptr<std::vector<std::size_t>> i_global_local = std::make_shared<std::vector<std::size_t>>();

  subgraph.update_levels(graph, 1, i_global_local);
  EXPECT_FALSE(i_global_local == nullptr);
  EXPECT_FALSE(i_global_local->empty());
  EXPECT_TRUE(subgraph.is_parent(graph));

  // Check graph details
  EXPECT_EQ(subgraph.size_vertex(), 5);
  EXPECT_EQ(subgraph.size_edge(), 4);
  EXPECT_EQ(subgraph.vertex_level(0), 0);
  EXPECT_EQ(subgraph.vertex_level(1), 1);
  EXPECT_EQ(subgraph.vertex_level(2), 1);
  EXPECT_EQ(subgraph.vertex_level(3), 1);
  EXPECT_EQ(subgraph.vertex_level(4), 1);
  FOR(i_vertex, subgraph.size_vertex())
  EXPECT_EQ((*i_global_local)[subgraph.local_global(i_vertex)], i_vertex);
  EXPECT_EQ((*i_global_local)[0], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[2], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[6], std::numeric_limits<std::size_t>::max());
  EXPECT_EQ((*i_global_local)[8], std::numeric_limits<std::size_t>::max());

  subgraph.update_levels(graph, 0);
  EXPECT_TRUE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 1);
  EXPECT_EQ(subgraph.size_edge(), 0);

  // Check graph details
  EXPECT_EQ(subgraph.vertex_level(0), 0);
  EXPECT_EQ(subgraph.local_global(0), 4);

  EXPECT_DEATH(subgraph.update_levels(Adjacency_Graph<false>(), 1, i_global_local), "./*");
  EXPECT_NO_THROW(Adjacency_Subgraph(graph, {4}, 2).update_levels(graph, 1););  // ensure default does not throw.
}